

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O3

void sdefl_fnd(sdefl_match *m,sdefl *s,int chain_len,int max_match,uchar *in,int p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  iVar1 = 0x7fff;
  if (0x7fff < p) {
    iVar1 = p;
  }
  uVar2 = s->tbl[(uint)(*(int *)(in + p) * -0x61c88677) >> 0x11];
  if ((int)uVar2 <= iVar1 + -0x8000) {
    return;
  }
  iVar5 = m->len;
  do {
    if ((in[(int)(iVar5 + uVar2)] == in[iVar5 + p]) &&
       (*(int *)(in + (int)uVar2) == *(int *)(in + p))) {
      uVar4 = 4;
      if (4 < max_match) {
        uVar4 = 4;
        do {
          if (in[uVar4 + (long)(int)uVar2] != in[uVar4 + (long)p]) goto LAB_00124831;
          uVar4 = uVar4 + 1;
        } while ((uint)max_match != uVar4);
        uVar4 = (ulong)(uint)max_match;
      }
LAB_00124831:
      iVar3 = (int)uVar4;
      if (iVar5 < iVar3) {
        m->len = iVar3;
        m->off = p - uVar2;
        iVar5 = iVar3;
        if (iVar3 == max_match) {
          return;
        }
      }
    }
    chain_len = chain_len + -1;
    if (chain_len == 0) {
      return;
    }
    uVar2 = s->prv[uVar2 & 0x7fff];
    if ((int)uVar2 <= iVar1 + -0x8000) {
      return;
    }
  } while( true );
}

Assistant:

static void
sdefl_fnd(struct sdefl_match *m, const struct sdefl *s,
          int chain_len, int max_match, const unsigned char *in, int p) {
  int i = s->tbl[sdefl_hash32(&in[p])];
  int limit = ((p-SDEFL_WIN_SIZ)<SDEFL_NIL)?SDEFL_NIL:(p-SDEFL_WIN_SIZ);
  while (i > limit) {
    if (in[i+m->len] == in[p+m->len] &&
        (sdefl_uload32(&in[i]) == sdefl_uload32(&in[p]))){
      int n = SDEFL_MIN_MATCH;
      while (n < max_match && in[i+n] == in[p+n]) n++;
      if (n > m->len) {
        m->len = n, m->off = p - i;
        if (n == max_match) break;
      }
    }
    if (!(--chain_len)) break;
    i = s->prv[i&SDEFL_WIN_MSK];
  }
}